

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testProcrustesWithMatrix<float>(M44d *m)

{
  ostream *poVar1;
  double b;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *this;
  Matrix44<double> *in_stack_00000010;
  Vec3<double> *in_stack_00000018;
  V3d toPt;
  V3d fromPt;
  size_t i;
  size_t numPoints;
  Rand48 random;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> toPoints;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> fromPoints;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *in_stack_000008b8;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *in_stack_000008c0;
  value_type *in_stack_ffffffffffffff28;
  Rand48 *in_stack_ffffffffffffff30;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
  *in_stack_ffffffffffffff40;
  Vec3<float> local_a8;
  Vec3<float> local_9c;
  Vec3<double> local_90;
  Vec3<double> local_78;
  ulong local_60;
  ulong local_58;
  
  std::operator<<((ostream *)&std::cout,"Testing Procrustes algorithm with arbitrary matrix: \n");
  Imath_2_5::operator<<((ostream *)fromPt.z,(Matrix44<double> *)fromPt.y);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::vector
            ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x17776f);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::vector
            ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x17777c);
  Imath_2_5::Rand48::Rand48(in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28);
  std::operator<<((ostream *)&std::cout,"   numPoints: ");
  for (local_58 = 1; local_58 < 10; local_58 = local_58 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_58);
    poVar1 = std::operator<<(poVar1," ");
    std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
    std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::clear
              ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x177813)
    ;
    std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::clear
              ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x177820)
    ;
    for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
      in_stack_ffffffffffffff40 =
           (vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
           Imath_2_5::Rand48::nextf((Rand48 *)0x177849);
      b = Imath_2_5::Rand48::nextf((Rand48 *)0x17785e);
      this = (vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
             Imath_2_5::Rand48::nextf((Rand48 *)0x177873);
      Imath_2_5::Vec3<double>::Vec3(&local_78,(double)in_stack_ffffffffffffff40,b,(double)this);
      Imath_2_5::operator*(in_stack_00000018,in_stack_00000010);
      Imath_2_5::Vec3<float>::Vec3<double>(&local_9c,&local_78);
      std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::push_back
                (this,in_stack_ffffffffffffff28);
      Imath_2_5::Vec3<float>::Vec3<double>(&local_a8,&local_90);
      std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::push_back
                (this,in_stack_ffffffffffffff28);
    }
    verifyProcrustes<float>(in_stack_000008c0,in_stack_000008b8);
  }
  std::operator<<((ostream *)&std::cout,"OK\n");
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::~vector
            (in_stack_ffffffffffffff40);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::~vector
            (in_stack_ffffffffffffff40);
  return;
}

Assistant:

void
testProcrustesWithMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing Procrustes algorithm with arbitrary matrix: \n" << m;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > toPoints;

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    std::cout << "   numPoints: ";
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        std::cout << numPoints << " " << std::flush;
        fromPoints.clear(); toPoints.clear();
        for (size_t i = 0; i < numPoints; ++i)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d fromPt (random.nextf(), random.nextf(), random.nextf());
            const IMATH_INTERNAL_NAMESPACE::V3d toPt = fromPt * m;
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(fromPt));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(toPt));
        }
        verifyProcrustes (fromPoints, toPoints);
    }
    std::cout << "OK\n";
}